

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

void __thiscall
rcc::shared_ptr<TestSharedPtrObj>::shared_ptr
          (shared_ptr<TestSharedPtrObj> *this,weak_ptr<TestSharedPtrObj> *other)

{
  IObject *pIVar1;
  TestSharedPtrObj *local_30;
  weak_ptr<TestSharedPtrObj> *other_local;
  shared_ptr<TestSharedPtrObj> *this_local;
  
  this->obj_state = (IObjectSharedState *)0x0;
  this->obj_pointer = (TestSharedPtrObj *)0x0;
  this->obj_state = other->obj_state;
  if (this->obj_state != (IObjectSharedState *)0x0) {
    pIVar1 = IObjectSharedState::GetIObject(this->obj_state);
    if (pIVar1 == (IObject *)0x0) {
      local_30 = (TestSharedPtrObj *)0x0;
    }
    else {
      local_30 = (TestSharedPtrObj *)
                 __dynamic_cast(pIVar1,&IObject::typeinfo,&TestSharedPtrObj::typeinfo,0);
    }
    this->obj_pointer = local_30;
  }
  if ((this->obj_state != (IObjectSharedState *)0x0) &&
     (this->obj_pointer != (TestSharedPtrObj *)0x0)) {
    other->obj_state = (IObjectSharedState *)0x0;
    IObjectSharedState::IncrementObject(this->obj_state);
  }
  return;
}

Assistant:

shared_ptr(weak_ptr<T>&& other){
            this->obj_state = other.obj_state;
            if (obj_state)
                obj_pointer = dynamic_cast<T*>(this->obj_state->GetIObject());
            if(obj_state && obj_pointer){
                other.obj_state = nullptr;
                obj_state->IncrementObject();
            }
        }